

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O1

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>
::Simplex_boundary_enumerator::next
          (optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,Simplex_boundary_enumerator *this)

{
  char cVar1;
  bool bVar2;
  vertex_t vVar3;
  long lVar4;
  long lVar5;
  simplex_t index;
  value_t vVar6;
  
  if (this->k < '\0') {
    bVar2 = false;
  }
  else {
    vVar3 = Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::get_max_vertex
                      (this->simplex_encoding,this->idx_below,this->k + '\x01',this->j);
    this->j = vVar3;
    lVar5 = 1;
    lVar4 = 1;
    if (this->k != -1) {
      lVar4 = (long)vVar3 << (this->k * (char)this->simplex_encoding->bits_per_vertex & 0x3fU);
    }
    index = (this->idx_above - lVar4) + this->idx_below;
    vVar6 = compute_diameter(this->parent,index,this->dim + -1);
    cVar1 = this->k;
    if (cVar1 != -1) {
      lVar5 = (long)this->j << ((char)this->simplex_encoding->bits_per_vertex * cVar1 & 0x3fU);
    }
    this->idx_below = this->idx_below - lVar5;
    if (cVar1 == '\0') {
      lVar4 = 1;
    }
    else {
      lVar4 = (long)this->j <<
              ((cVar1 + -1) * (char)this->simplex_encoding->bits_per_vertex & 0x3fU);
    }
    this->idx_above = this->idx_above + lVar4;
    this->k = cVar1 + -1;
    (__return_storage_ptr__->
    super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
    )._M_payload.
    super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
    ._M_payload._M_value.
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
    .first = vVar6;
    *(simplex_t *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
             )._M_payload.
             super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
             ._M_payload + 8) = index;
    bVar2 = true;
  }
  (__return_storage_ptr__->
  super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
  )._M_payload.
  super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
  ._M_engaged = bVar2;
  return __return_storage_ptr__;
}

Assistant:

std::optional<diameter_entry_t> next() {
        if (!has_next()) return std::nullopt;
        j = simplex_encoding.get_max_vertex(idx_below, k + 1, j);

        simplex_t face_index = idx_above - simplex_encoding(j, k + 1) + idx_below;

        // It would make sense to extract the vertices once in set_simplex
        // and pass the proper subset to compute_diameter, but even in cases
        // where this dominates it does not seem to help (probably because we
        // stop at the first coface).
        value_t face_diameter = parent.compute_diameter(face_index, dim - 1);

        const coefficient_t modulus = parent.modulus;
        coefficient_t face_coefficient =
          (k & 1 ? -1 + modulus : 1) * parent.get_coefficient(simplex) % modulus;

        idx_below -= simplex_encoding(j, k + 1);
        idx_above += simplex_encoding(j, k);

        --k;

        return parent.make_diameter_entry(face_diameter, face_index, face_coefficient);
      }